

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

void __thiscall deqp::gls::FboUtil::FboBuilder::~FboBuilder(FboBuilder *this)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->super_Framebuffer).textures._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->super_Framebuffer).textures._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    FboUtil::config::glDelete((Image *)p_Var1[1]._M_parent,p_Var1[1]._M_color,this->m_gl);
  }
  for (p_Var1 = (this->super_Framebuffer).rbos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->super_Framebuffer).rbos._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    FboUtil::config::glDelete((Image *)p_Var1[1]._M_parent,p_Var1[1]._M_color,this->m_gl);
  }
  (*this->m_gl->bindFramebuffer)(this->m_target,0);
  for (p_Var1 = (this->m_configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_configs)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  std::
  _Rb_tree<deqp::gls::FboUtil::config::Config_*,_deqp::gls::FboUtil::config::Config_*,_std::_Identity<deqp::gls::FboUtil::config::Config_*>,_std::less<deqp::gls::FboUtil::config::Config_*>,_std::allocator<deqp::gls::FboUtil::config::Config_*>_>
  ::~_Rb_tree(&(this->m_configs)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>_>
  ::~_Rb_tree(&(this->super_Framebuffer).rbos._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>_>
  ::~_Rb_tree(&(this->super_Framebuffer).textures._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
               *)this);
  return;
}

Assistant:

FboBuilder::~FboBuilder (void)
{
	for (TextureMap::const_iterator it = textures.begin(); it != textures.end(); it++)
	{
		glDelete(*it->second, it->first, m_gl);
	}
	for (RboMap::const_iterator it = rbos.begin(); it != rbos.end(); it++)
	{
		glDelete(*it->second, it->first, m_gl);
	}
	m_gl.bindFramebuffer(m_target, 0);
	for (Configs::const_iterator it = m_configs.begin(); it != m_configs.end(); it++)
	{
		delete *it;
	}
}